

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O1

filename_t * __thiscall
spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>::calc_filename
          (filename_t *__return_storage_ptr__,rotating_file_sink<spdlog::details::null_mutex> *this,
          filename_t *filename,size_t index)

{
  _func_int **pp_Var1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  basic_string_view<char> fmt;
  string_view fmt_00;
  format_args args;
  filename_t ext;
  filename_t basename;
  undefined1 local_c8 [32];
  _Alloc_hider local_a8;
  size_type sStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  code *local_88;
  code *pcStack_80;
  code *local_78;
  char *local_68;
  size_type sStack_60;
  char local_58 [16];
  char *local_48;
  size_type sStack_40;
  char local_38 [16];
  
  if (filename == (filename_t *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pp_Var1 = (this->super_base_sink<spdlog::details::null_mutex>).super_sink._vptr_sink;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pp_Var1,
               *(long *)&(this->super_base_sink<spdlog::details::null_mutex>).super_sink.level_ +
               (long)pp_Var1);
  }
  else {
    sStack_40 = 0;
    local_38[0] = '\0';
    sStack_60 = 0;
    local_58[0] = '\0';
    local_68 = local_58;
    local_48 = local_38;
    details::file_helper::split_by_extension
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c8,(filename_t *)this);
    std::__cxx11::string::operator=((string *)&local_48,(string *)&local_a8);
    std::__cxx11::string::operator=((string *)&local_68,(string *)local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p);
    }
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_);
    }
    local_c8._0_8_ = (pointer)0x40000000d;
    local_c8._8_4_ = 0xd;
    local_c8._16_8_ = 0;
    local_c8._24_4_ = 0;
    local_a8._M_p = "{}.{}{}";
    sStack_a0 = 7;
    local_98._M_allocated_capacity = 0x300000000;
    local_88 = ::fmt::v11::detail::invoke_parse<std::__cxx11::string&,char>;
    pcStack_80 = ::fmt::v11::detail::invoke_parse<unsigned_long&,char>;
    local_78 = ::fmt::v11::detail::invoke_parse<std::__cxx11::string&,char>;
    fmt.size_ = (size_t)local_c8;
    fmt.data_ = (char *)0x7;
    local_98._8_8_ = local_c8;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,3,0,false>>
              ((detail *)"{}.{}{}",fmt,(format_string_checker<char,_3,_0,_false> *)index);
    local_c8._0_8_ = local_48;
    local_c8._8_8_ = sStack_40;
    local_a8._M_p = local_68;
    sStack_a0 = sStack_60;
    fmt_00.size_ = 0xd4d;
    fmt_00.data_ = (char *)0x7;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_c8;
    local_c8._16_8_ = filename;
    ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)"{}.{}{}",fmt_00,args);
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::calc_filename(const filename_t &filename,
                                                                  std::size_t index) {
    if (index == 0u) {
        return filename;
    }

    filename_t basename, ext;
    std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
    return fmt_lib::format(SPDLOG_FMT_STRING(SPDLOG_FILENAME_T("{}.{}{}")), basename, index, ext);
}